

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_pink.c
# Opt level: O2

void InitializePinkNoise(PinkNoise *pink,int numRows)

{
  ulong uVar1;
  ulong uVar2;
  
  pink->pink_Index = 0;
  pink->pink_IndexMask = ~(-1 << ((byte)numRows & 0x1f));
  pink->pink_Scalar = 1.0 / (float)(numRows * 0x800000 + 0x800000);
  uVar1 = 0;
  uVar2 = (ulong)(uint)numRows;
  if (numRows < 1) {
    uVar2 = 0;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    pink->pink_Rows[uVar1] = 0;
  }
  pink->pink_RunningSum = 0;
  return;
}

Assistant:

void InitializePinkNoise( PinkNoise *pink, int numRows )
{
    int i;
    long pmax;
    pink->pink_Index = 0;
    pink->pink_IndexMask = (1<<numRows) - 1;
    /* Calculate maximum possible signed random value. Extra 1 for white noise always added. */
    pmax = (numRows + 1) * (1<<(PINK_RANDOM_BITS-1));
    pink->pink_Scalar = 1.0f / pmax;
    /* Initialize rows. */
    for( i=0; i<numRows; i++ ) pink->pink_Rows[i] = 0;
    pink->pink_RunningSum = 0;
}